

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDVertexTag __thiscall
ON_SubDVertex::SuggestedVertexTag
          (ON_SubDVertex *this,bool bApplyInputTagBias,bool bReturnBestGuessWhenInvalid)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  ON_SubDVertexTag OVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar6 = 0;
  uVar2 = (uint)this->m_edge_count;
  if (this->m_edges == (ON_SubDEdgePtr *)0x0) {
    uVar2 = 0;
  }
  OVar4 = Corner;
  if (1 < uVar2) {
    uVar8 = 0;
    uVar7 = 0;
    uVar5 = 0;
    iVar3 = 0;
    do {
      uVar9 = this->m_edges[uVar8].m_ptr & 0xfffffffffffffff8;
      if (uVar9 != 0) {
        sVar1 = *(short *)(uVar9 + 100);
        if (sVar1 == 2) {
          uVar5 = uVar5 + 1;
          uVar7 = uVar7 + (*(char *)(uVar9 + 0x60) == '\x02');
        }
        else {
          if (sVar1 == 1) {
            iVar3 = iVar3 + 1;
          }
          else {
            if (sVar1 != 0) {
              return Corner;
            }
            iVar6 = iVar6 + 1;
          }
          uVar7 = uVar7 + 1;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
    if (uVar7 < 3) {
      if (iVar6 == 0) {
        if (uVar7 != 2) {
          if (uVar7 != 1) {
            return 1 < uVar5 || bReturnBestGuessWhenInvalid;
          }
          OVar4 = Dart;
          if (uVar5 < 2) {
            OVar4 = bReturnBestGuessWhenInvalid * '\x03';
          }
          if (iVar3 == 0) {
            return OVar4;
          }
          return bReturnBestGuessWhenInvalid * '\x03';
        }
        if ((iVar3 != 2) && (iVar3 != 0 || uVar5 < 2)) {
          return bReturnBestGuessWhenInvalid * '\x03';
        }
      }
      else if ((iVar6 != 2 || iVar3 != 0) || uVar5 != 0) {
        return Corner;
      }
      OVar4 = (bApplyInputTagBias && this->m_vertex_tag == Corner) | Crease;
    }
  }
  return OVar4;
}

Assistant:

ON_SubDVertexTag ON_SubDVertex::SuggestedVertexTag(
  bool bApplyInputTagBias,
  bool bReturnBestGuessWhenInvalid
) const
{
  unsigned wire_count = 0;
  unsigned boundary_count = 0;
  unsigned interior_count = 0;

  unsigned crease_count = 0;

  const unsigned edge_count = (nullptr != m_edges ? m_edge_count : 0U);
  if ( edge_count < 2)
    return ON_SubDVertexTag::Corner;

  for (unsigned vei = 0; vei < edge_count; ++vei)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr == e)
      continue;
    switch(e->m_face_count)
    {
    case 0:
      ++wire_count;
      ++crease_count;
      break;
    case 1:
      ++boundary_count;
      ++crease_count;
      break;
    case 2:
      ++interior_count;
      if (ON_SubDEdgeTag::Crease == e->m_edge_tag)
        ++crease_count;
      break;
    default: // nonmanifold edge
      return ON_SubDVertexTag::Corner;
      break;
    }
  }

  if (crease_count >= 3)
    return ON_SubDVertexTag::Corner;

  if (wire_count > 0)
  {
    if (2 == wire_count && 0 == boundary_count && 0 == interior_count)
      return (bApplyInputTagBias && ON_SubDVertexTag::Corner == m_vertex_tag) ? ON_SubDVertexTag::Corner : ON_SubDVertexTag::Crease;
    return ON_SubDVertexTag::Corner;
  }

  ON_SubDVertexTag best_guess_tag = ON_SubDVertexTag::Unset;
  // crease_count >= 3 handled above
  switch (crease_count)
  {
  case 0:
    if (interior_count >= 2)
      return ON_SubDVertexTag::Smooth;
    if (bReturnBestGuessWhenInvalid)
    {
      // can occur when there is a nullptr edge
      best_guess_tag = ON_SubDVertexTag::Smooth;
    }
    break;
  case 1:
    if (0 == boundary_count && interior_count >= 2)
      return ON_SubDVertexTag::Dart;
    if (bReturnBestGuessWhenInvalid)
    {
      // topology is far from valid and dart evaluation is very delicate. 
      // We need more boundary edges, but using corner will at least give a well defined vertex surface point.
      best_guess_tag = ON_SubDVertexTag::Corner;
    }
    break;
  case 2:
    if(  (0 == boundary_count && interior_count >= 2) || (2 == boundary_count) )
      return (bApplyInputTagBias && ON_SubDVertexTag::Corner == m_vertex_tag) ? ON_SubDVertexTag::Corner : ON_SubDVertexTag::Crease;
    if (bReturnBestGuessWhenInvalid)
    {
      // topology is far from valid and dart evaluation is very delicate. 
      // We need more boundary edges, but using corner will at least give a well defined vertex surface point.
      best_guess_tag = ON_SubDVertexTag::Corner;
    }
    break;
  }

  return best_guess_tag;
}